

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

base_learner * nn_setup(options_i *options,vw *all)

{
  uint64_t uVar1;
  vw *pvVar2;
  long *plVar3;
  byte bVar4;
  pointer pnVar5;
  ostream *poVar6;
  loss_function *plVar7;
  float *pfVar8;
  bool *pbVar9;
  polyprediction *ppVar10;
  learner<nn,_example> *this;
  vw *in_RSI;
  char *pcVar11;
  long *in_RDI;
  learner<nn,_example> *l;
  nn *nv;
  single_learner *base;
  option_group_definition new_options;
  bool meanfield;
  free_ptr<nn> n;
  typed_option<bool> *in_stack_fffffffffffff528;
  vw *in_stack_fffffffffffff530;
  string *in_stack_fffffffffffff538;
  _func_void_nn_ptr_learner<char,_example>_ptr_example_ptr *predict;
  single_learner *in_stack_fffffffffffff540;
  learner<char,_example> *in_stack_fffffffffffff548;
  learner<nn,_example> *f;
  single_learner *this_00;
  typed_option<bool> *in_stack_fffffffffffff578;
  option_group_definition *in_stack_fffffffffffff580;
  allocator *l_00;
  allocator *nmemb;
  allocator local_8e1;
  string local_8e0 [28];
  float in_stack_fffffffffffff73c;
  string *in_stack_fffffffffffff740;
  vw *in_stack_fffffffffffff748;
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [359];
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [32];
  typed_option<bool> local_690 [2];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [32];
  typed_option<bool> local_500 [2];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  typed_option<bool> local_370 [2];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<unsigned_int> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  undefined1 local_29;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<nn>();
  local_29 = 0;
  nmemb = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Neural Network",nmemb);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff530,
             (string *)in_stack_fffffffffffff528);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  l_00 = &local_201;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"nn",l_00);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2be860);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff538,(uint *)in_stack_fffffffffffff530)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,"Sigmoidal feedforward network with <k> hidden units",&local_229);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530,
             (string *)in_stack_fffffffffffff528);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530,
             (typed_option<unsigned_int> *)in_stack_fffffffffffff528);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff580,(typed_option<unsigned_int> *)in_stack_fffffffffffff578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"inpass",&local_391);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2be95e);
  VW::config::make_option<bool>(in_stack_fffffffffffff538,(bool *)in_stack_fffffffffffff530);
  VW::config::typed_option<bool>::keep(local_370,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b8,"Train or test sigmoidal feedforward network with input passthrough.",
             &local_3b9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff530,(string *)in_stack_fffffffffffff528);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"multitask",&local_521);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2bea63);
  VW::config::make_option<bool>(in_stack_fffffffffffff538,(bool *)in_stack_fffffffffffff530);
  VW::config::typed_option<bool>::keep(local_500,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"Share hidden layer across all reduced tasks.",&local_549);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff530,(string *)in_stack_fffffffffffff528);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"dropout",&local_6b1);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2beb68);
  VW::config::make_option<bool>(in_stack_fffffffffffff538,(bool *)in_stack_fffffffffffff530);
  VW::config::typed_option<bool>::keep(local_690,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6d8,"Train or test sigmoidal feedforward network using dropout.",&local_6d9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff530,(string *)in_stack_fffffffffffff528);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"meanfield",&local_841);
  VW::config::make_option<bool>(in_stack_fffffffffffff538,(bool *)in_stack_fffffffffffff530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_868,"Train or test sigmoidal feedforward network using mean field.",&local_869);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff530,(string *)in_stack_fffffffffffff528);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  VW::config::option_group_definition::add<bool>
            (in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff530);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  (**(code **)*local_10)(local_10,local_68);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"nn",&local_891);
  bVar4 = (**(code **)(*plVar3 + 8))(plVar3,local_890);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  pvVar2 = local_18;
  if (((bVar4 ^ 0xff) & 1) == 0) {
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf474);
    pnVar5->all = pvVar2;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf490);
    if (((pnVar5->multitask & 1U) != 0) && ((local_18->quiet & 1U) == 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"using multitask sharing for neural network ");
      pcVar11 = "testing";
      if ((local_18->training & 1U) != 0) {
        pcVar11 = "training";
      }
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffff748,"meanfield",(allocator *)&stack0xfffffffffffff747)
    ;
    bVar4 = (**(code **)(*local_10 + 8))(local_10,&stack0xfffffffffffff748);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff748);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff747);
    if ((bVar4 & 1) != 0) {
      pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                         ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf5b9);
      pnVar5->dropout = false;
      if ((local_18->quiet & 1U) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"using mean field for neural network ");
        pcVar11 = "testing";
        if ((local_18->training & 1U) != 0) {
          pcVar11 = "training";
        }
        poVar6 = std::operator<<(poVar6,pcVar11);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf69c);
    if (((pnVar5->dropout & 1U) != 0) && ((local_18->quiet & 1U) == 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"using dropout for neural network ");
      pcVar11 = "testing";
      if ((local_18->training & 1U) != 0) {
        pcVar11 = "training";
      }
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf736);
    if (((pnVar5->inpass & 1U) != 0) && ((local_18->quiet & 1U) == 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"using input passthrough for neural network ");
      pcVar11 = "testing";
      if ((local_18->training & 1U) != 0) {
        pcVar11 = "training";
      }
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf7d0);
    pnVar5->finished_setup = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8e0,"squared",&local_8e1);
    plVar7 = getLossFunction(in_stack_fffffffffffff748,in_stack_fffffffffffff740,
                             in_stack_fffffffffffff73c);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf84e);
    pnVar5->squared_loss = plVar7;
    std::__cxx11::string::~string(local_8e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
    uVar1 = local_18->random_seed;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf892);
    pnVar5->xsubi = uVar1;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf8a8);
    uVar1 = pnVar5->xsubi;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf8be);
    pnVar5->save_xsubi = uVar1;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf8d4);
    pfVar8 = calloc_or_throw<float>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf8f9);
    pnVar5->hidden_units = pfVar8;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf912);
    pbVar9 = calloc_or_throw<bool>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf934);
    pnVar5->dropped_out = pbVar9;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf94a);
    ppVar10 = calloc_or_throw<polyprediction>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf96c);
    pnVar5->hidden_units_pred = ppVar10;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf982);
    ppVar10 = calloc_or_throw<polyprediction>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bf99f);
    pnVar5->hiddenbias_pred = ppVar10;
    setup_base((options_i *)in_stack_fffffffffffff538,in_stack_fffffffffffff530);
    in_stack_fffffffffffff540 = LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
    in_stack_fffffffffffff530 = *(vw **)(in_stack_fffffffffffff540 + 0xe0);
    predict = (_func_void_nn_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
    this_00 = in_stack_fffffffffffff540;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2bfa0b);
    pnVar5->increment = (size_t)in_stack_fffffffffffff530;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::get
                       ((unique_ptr<nn,_void_(*)(void_*)> *)in_stack_fffffffffffff530);
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2bfa40);
    this = LEARNER::init_learner<nn,example,LEARNER::learner<char,example>>
                     ((free_ptr<nn> *)this_00,in_stack_fffffffffffff548,
                      (_func_void_nn_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff540,predict,(size_t)in_stack_fffffffffffff530);
    f = this;
    if ((pnVar5->multitask & 1U) != 0) {
      LEARNER::learner<nn,example>::set_multipredict<LEARNER::learner<char,example>>
                ((learner<nn,example> *)this,multipredict);
    }
    LEARNER::learner<nn,_example>::set_finish
              ((learner<nn,_example> *)this_00,(_func_void_nn_ptr *)f);
    LEARNER::learner<nn,_example>::set_finish_example(this,finish_example);
    LEARNER::learner<nn,_example>::set_end_pass
              ((learner<nn,_example> *)this_00,(_func_void_nn_ptr *)f);
    local_8 = LEARNER::make_base<nn,example>(this);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff530);
  std::unique_ptr<nn,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<nn,_void_(*)(void_*)> *)in_stack_fffffffffffff540);
  return local_8;
}

Assistant:

base_learner* nn_setup(options_i& options, vw& all)
{
  auto n = scoped_calloc_or_throw<nn>();
  bool meanfield = false;
  option_group_definition new_options("Neural Network");
  new_options.add(make_option("nn", n->k).keep().help("Sigmoidal feedforward network with <k> hidden units"))
      .add(make_option("inpass", n->inpass)
               .keep()
               .help("Train or test sigmoidal feedforward network with input passthrough."))
      .add(make_option("multitask", n->multitask).keep().help("Share hidden layer across all reduced tasks."))
      .add(make_option("dropout", n->dropout).keep().help("Train or test sigmoidal feedforward network using dropout."))
      .add(make_option("meanfield", meanfield).help("Train or test sigmoidal feedforward network using mean field."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("nn"))
    return nullptr;

  n->all = &all;

  if (n->multitask && !all.quiet)
    std::cerr << "using multitask sharing for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (options.was_supplied("meanfield"))
  {
    n->dropout = false;
    if (!all.quiet)
      std::cerr << "using mean field for neural network " << (all.training ? "training" : "testing") << std::endl;
  }

  if (n->dropout && !all.quiet)
    std::cerr << "using dropout for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (n->inpass && !all.quiet)
    std::cerr << "using input passthrough for neural network " << (all.training ? "training" : "testing") << std::endl;

  n->finished_setup = false;
  n->squared_loss = getLossFunction(all, "squared", 0);

  n->xsubi = all.random_seed;

  n->save_xsubi = n->xsubi;

  n->hidden_units = calloc_or_throw<float>(n->k);
  n->dropped_out = calloc_or_throw<bool>(n->k);
  n->hidden_units_pred = calloc_or_throw<polyprediction>(n->k);
  n->hiddenbias_pred = calloc_or_throw<polyprediction>(n->k);

  auto base = as_singleline(setup_base(options, all));
  n->increment = base->increment;  // Indexing of output layer is odd.
  nn& nv = *n.get();
  learner<nn, example>& l =
      init_learner(n, base, predict_or_learn_multi<true, true>, predict_or_learn_multi<false, true>, n->k + 1);
  if (nv.multitask)
    l.set_multipredict(multipredict);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}